

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  parasail_result_t *ppVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  parasail_result_t *ppVar18;
  __m128i *palVar19;
  __m128i *ptr;
  __m128i *palVar20;
  __m128i *ptr_00;
  __m128i *palVar21;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int64_t *ptr_03;
  __m128i *ptr_04;
  uint uVar22;
  int iVar23;
  long lVar24;
  parasail_result_t *ppVar25;
  parasail_result_t *ppVar26;
  char *pcVar27;
  ulong uVar29;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  ulong uVar30;
  __m128i *ptr_05;
  uint uVar28;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  __m128i *ptr_06;
  char *__format;
  long lVar36;
  long lVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  longlong lVar42;
  ulong size;
  parasail_result_t *ppVar43;
  int iVar44;
  longlong lVar45;
  int iVar46;
  int iVar47;
  longlong lVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  int64_t iVar62;
  longlong lVar63;
  __m128i_64_t B;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  longlong lVar71;
  undefined1 auVar70 [16];
  longlong lVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  longlong lVar79;
  undefined1 auVar78 [16];
  longlong lVar80;
  __m128i_64_t B_3;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  longlong lVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  __m128i_64_t B_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  long lVar104;
  undefined1 auVar103 [16];
  __m128i alVar105;
  __m128i alVar106;
  __m128i alVar107;
  __m128i alVar108;
  __m128i c;
  __m128i c_00;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i alVar109;
  __m128i *local_320;
  undefined1 local_2f8 [16];
  __m128i *local_2e0;
  ulong local_2d8;
  undefined8 uStack_2d0;
  long local_278;
  long lStack_270;
  undefined1 local_248 [16];
  long local_230;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  ulong uStack_150;
  long lStack_f0;
  undefined8 local_98;
  undefined8 uStack_90;
  long local_68;
  long lStack_60;
  __m128i_64_t e;
  __m128i_64_t h;
  size_t len;
  long lVar37;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar27 = "profile";
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar27 = "profile->profile64.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar27 = "profile->matrix";
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar27 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar27 = "s2";
        }
        else {
          uVar33 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar27 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar27 = "open";
          }
          else {
            if (-1 < gap) {
              uVar31 = uVar4 - 1;
              size = (ulong)uVar4 + 1 >> 1;
              uVar10 = (ulong)uVar31 % size;
              pvVar7 = (profile->profile64).matches;
              pvVar8 = (profile->profile64).similar;
              uVar29 = (ulong)(uint)open;
              iVar46 = -open;
              iVar23 = ppVar6->min;
              local_2d8 = 0x8000000000000000 - (long)iVar23;
              if (iVar23 != iVar46 && SBORROW4(iVar23,iVar46) == iVar23 + open < 0) {
                local_2d8 = uVar29 | 0x8000000000000000;
              }
              iVar23 = ppVar6->max;
              ppVar18 = parasail_result_new_table3((uint)((ulong)uVar4 + 1) & 0x7ffffffe,s2Len);
              if (ppVar18 != (parasail_result_t *)0x0) {
                ppVar18->flag =
                     (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                     (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar18->flag |
                     0x2830802;
                local_320 = parasail_memalign___m128i(0x10,size);
                alVar109[0] = parasail_memalign___m128i(0x10,size);
                palVar19 = parasail_memalign___m128i(0x10,size);
                ptr = parasail_memalign___m128i(0x10,size);
                palVar20 = parasail_memalign___m128i(0x10,size);
                ptr_00 = parasail_memalign___m128i(0x10,size);
                palVar21 = parasail_memalign___m128i(0x10,size);
                ptr_01 = parasail_memalign___m128i(0x10,size);
                ptr_02 = parasail_memalign___m128i(0x10,size);
                b = parasail_memalign___m128i(0x10,size);
                b_00 = parasail_memalign___m128i(0x10,size);
                b_01 = parasail_memalign___m128i(0x10,size);
                ptr_03 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
                auVar50._0_8_ = -(ulong)(local_320 == (__m128i *)0x0);
                auVar50._8_8_ = -(ulong)(alVar109[0] == (__m128i *)0x0);
                auVar73._0_8_ = -(ulong)(palVar19 == (__m128i *)0x0);
                auVar73._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
                auVar50 = packssdw(auVar50,auVar73);
                auVar84._0_8_ = -(ulong)(palVar20 == (__m128i *)0x0);
                auVar84._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
                auVar66._0_8_ = -(ulong)(palVar21 == (__m128i *)0x0);
                auVar66._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
                auVar73 = packssdw(auVar84,auVar66);
                auVar50 = packssdw(auVar50,auVar73);
                if (((((b != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0) && b_00 != (__m128i *)0x0)
                     && b_01 != (__m128i *)0x0) && ptr_03 != (int64_t *)0x0) &&
                    ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  && (auVar50 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                 (auVar50 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar50 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar50 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar50 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar50 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar50 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar50 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar50 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar50 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar50 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar50[0xf])) {
                  iVar17 = s2Len + -1;
                  uVar22 = 1 - (int)(uVar31 / size);
                  len = (size_t)uVar22;
                  uVar49 = (ulong)(uint)gap;
                  local_2e0 = (__m128i *)(local_2d8 + 1);
                  local_2f8._0_8_ = 0x7ffffffffffffffe - (long)iVar23;
                  auVar51._8_4_ = (int)local_2e0;
                  auVar51._0_8_ = local_2e0;
                  auVar51._12_4_ = (int)((ulong)local_2e0 >> 0x20);
                  auVar95._8_4_ = (int)local_2f8._0_8_;
                  auVar95._0_8_ = local_2f8._0_8_;
                  auVar95._12_4_ = (int)((ulong)local_2f8._0_8_ >> 0x20);
                  auVar96._0_8_ = (long)(int)uVar22;
                  auVar96._8_4_ = uVar22;
                  auVar96._12_4_ = (int)uVar22 >> 0x1f;
                  alVar105[1] = (longlong)local_2e0;
                  alVar105[0] = size;
                  parasail_memset___m128i(palVar19,alVar105,len);
                  alVar106[1] = extraout_RDX;
                  alVar106[0] = size;
                  parasail_memset___m128i(palVar20,alVar106,len);
                  alVar107[1] = extraout_RDX_00;
                  alVar107[0] = size;
                  parasail_memset___m128i(palVar21,alVar107,len);
                  alVar108[1] = extraout_RDX_01;
                  alVar108[0] = size;
                  parasail_memset___m128i(b,alVar108,len);
                  c[1] = extraout_RDX_02;
                  c[0] = size;
                  parasail_memset___m128i(b_00,c,len);
                  c_00[1] = extraout_RDX_03;
                  c_00[0] = size;
                  parasail_memset___m128i(b_01,c_00,len);
                  lVar34 = (long)iVar46;
                  lVar35 = lVar34;
                  for (uVar30 = 0; uVar30 != size; uVar30 = uVar30 + 1) {
                    lVar36 = lVar35;
                    for (lVar38 = 0; lVar38 != 2; lVar38 = lVar38 + 1) {
                      lVar39 = lVar36;
                      if (s1_beg != 0) {
                        lVar39 = 0;
                      }
                      *(long *)((long)&h + lVar38 * 8) = lVar39;
                      *(ulong *)((long)&e + lVar38 * 8) = lVar39 - uVar29;
                      lVar36 = lVar36 - size * (uint)gap;
                    }
                    local_320[uVar30][0] = h.m[0];
                    local_320[uVar30][1] = h.m[1];
                    ptr_02[uVar30][0] = e.m[0];
                    ptr_02[uVar30][1] = e.m[1];
                    lVar35 = lVar35 - (ulong)(uint)gap;
                  }
                  *ptr_03 = 0;
                  for (uVar30 = 1; s2Len + 1 != uVar30; uVar30 = uVar30 + 1) {
                    iVar23 = 0;
                    if (s2_beg == 0) {
                      iVar23 = iVar46;
                    }
                    ptr_03[uVar30] = (long)iVar23;
                    iVar46 = iVar46 - gap;
                  }
                  uVar11 = (uint)size;
                  uVar30 = (ulong)(uVar11 - 1);
                  ppVar43 = (parasail_result_t *)(size * uVar33 * 4);
                  local_230 = 0;
                  local_178._8_8_ = auVar96._8_8_;
                  local_178._8_8_ = -(ulong)(local_178._8_8_ == 0);
                  local_178._0_8_ = -(ulong)(auVar96._0_8_ == 1);
                  uVar40 = 0;
                  lStack_f0 = auVar95._8_8_;
                  auVar50 = auVar51;
                  auVar73 = auVar51;
                  auVar84 = auVar51;
                  iVar23 = iVar17;
                  local_248 = auVar51;
                  local_188 = auVar51;
                  do {
                    ptr_06 = palVar21;
                    ptr_05 = palVar20;
                    palVar21 = palVar19;
                    ptr_04 = alVar109[0];
                    local_2f8._8_8_ = lStack_f0;
                    if (uVar40 == uVar33) {
                      lVar45 = 0;
                      if (s2_end == 0) {
                        lVar48 = 0;
                        lVar42 = 0;
                        alVar109[0] = palVar21;
                      }
                      else {
                        alVar109[0] = (__m128i *)0x1;
                        local_2e0 = (__m128i *)local_188._8_8_;
                        while( true ) {
                          palVar19 = (__m128i *)local_188._0_8_;
                          iVar46 = (int)lVar45;
                          lVar45 = auVar50._8_8_;
                          lVar48 = auVar73._8_8_;
                          lVar42 = auVar84._8_8_;
                          if ((int)uVar22 <= iVar46) break;
                          auVar13._8_8_ = 0;
                          auVar13._0_8_ = auVar50._0_8_;
                          auVar50 = auVar13 << 0x40;
                          auVar14._8_8_ = 0;
                          auVar14._0_8_ = auVar73._0_8_;
                          auVar73 = auVar14 << 0x40;
                          auVar15._8_8_ = 0;
                          auVar15._0_8_ = auVar84._0_8_;
                          auVar84 = auVar15 << 0x40;
                          lVar45 = 1;
                          local_188._0_8_ = (__m128i *)0x0;
                          local_2e0 = palVar19;
                        }
                      }
                      iVar46 = (int)lVar42;
                      iVar47 = (int)lVar48;
                      iVar44 = (int)lVar45;
                      a_04[0] = (ulong)uVar31;
                      palVar20 = ptr_05;
                      palVar19 = ptr_06;
                      uVar28 = uVar31;
                      if (s1_end != 0) {
                        alVar109[0] = (__m128i *)0x0;
                        uVar33 = a_04[0];
                        while( true ) {
                          iVar46 = (int)lVar42;
                          iVar47 = (int)lVar48;
                          iVar44 = (int)lVar45;
                          uVar28 = (uint)uVar33;
                          if ((uVar11 & 0x3fffffff) * 2 == (int)alVar109[0]) break;
                          palVar19 = (__m128i *)((ulong)alVar109[0] >> 1 & 0x7fffffff);
                          uVar28 = 0;
                          if (((ulong)alVar109[0] & 1) != 0) {
                            uVar28 = uVar11;
                          }
                          uVar28 = uVar28 + (int)palVar19;
                          palVar20 = (__m128i *)(ulong)uVar28;
                          if ((int)uVar28 < (int)uVar4) {
                            palVar19 = (__m128i *)(*local_320)[(long)alVar109[0]];
                            if (((long)local_2e0 < (long)palVar19) ||
                               (((palVar19 == local_2e0 && (iVar23 == iVar17)) &&
                                (palVar19 = local_2e0, (int)uVar28 < (int)(uint)uVar33)))) {
                              lVar45 = (*palVar21)[(long)alVar109[0]];
                              lVar48 = (*ptr_05)[(long)alVar109[0]];
                              lVar42 = (*ptr_06)[(long)alVar109[0]];
                              uVar33 = (ulong)uVar28;
                              iVar23 = iVar17;
                              local_2e0 = palVar19;
                            }
                          }
                          alVar109[0] = (__m128i *)((long)*alVar109[0] + 1);
                        }
                      }
                      if (s2_end == 0 && s1_end == 0) {
                        palVar20 = (__m128i *)(ulong)uVar22;
                        alVar109[0] = (__m128i *)0x0;
                        lVar45 = local_320[uVar10][0];
                        lVar48 = local_320[uVar10][1];
                        lVar42 = palVar21[uVar10][0];
                        lVar71 = palVar21[uVar10][1];
                        lVar63 = ptr_05[uVar10][0];
                        lVar79 = ptr_05[uVar10][1];
                        lVar72 = ptr_06[uVar10][0];
                        lVar85 = ptr_06[uVar10][1];
                        while (lVar80 = lVar72, lVar72 = lVar63, lVar63 = lVar42, lVar42 = lVar45,
                              local_2e0._0_4_ = (int)lVar48, (int)alVar109[0] < (int)uVar22) {
                          lVar45 = 0;
                          lVar48 = lVar42;
                          lVar42 = 0;
                          lVar71 = lVar63;
                          lVar63 = 0;
                          lVar79 = lVar72;
                          lVar72 = 0;
                          lVar85 = lVar80;
                          alVar109[0] = (__m128i *)0x1;
                        }
                        iVar44 = (int)lVar71;
                        iVar47 = (int)lVar79;
                        iVar46 = (int)lVar85;
                        iVar23 = iVar17;
                        uVar28 = uVar31;
                      }
                      local_1d8 = (undefined4)local_2d8;
                      uStack_1d4 = (undefined4)(local_2d8 >> 0x20);
                      uStack_2d0._0_4_ = local_1d8;
                      uStack_2d0._4_4_ = uStack_1d4;
                      b_06[1] = (longlong)alVar109[0];
                      b_06[0] = (longlong)palVar20;
                      a_04[1] = (longlong)palVar19;
                      _mm_cmpgt_epi64_rpl(a_04,b_06);
                      auVar78._0_8_ = -(ulong)((long)local_2d8 < (long)local_2f8._0_8_);
                      auVar78._8_8_ = -(ulong)(uStack_2d0 < lStack_f0);
                      auVar70._8_4_ = 0xffffffff;
                      auVar70._0_8_ = 0xffffffffffffffff;
                      auVar70._12_4_ = 0xffffffff;
                      auVar50 = auVar70 ^ auVar78 | extraout_XMM0_04;
                      if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar50 >> 0xf & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar50 >> 0x17 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                     (auVar50 >> 0x1f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar50 >> 0x27 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar50 >> 0x2f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar50 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar50 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar50 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar50 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar50 >> 0x57 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar50 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar50 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar50 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar50[0xf] < '\0') {
                        *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                        local_2e0._0_4_ = 0;
                        iVar44 = 0;
                        iVar47 = 0;
                        iVar46 = 0;
                        iVar23 = 0;
                        uVar28 = 0;
                      }
                      ppVar18->score = (int)local_2e0;
                      ppVar18->end_query = uVar28;
                      ppVar18->end_ref = iVar23;
                      ((ppVar18->field_4).stats)->matches = iVar44;
                      ((ppVar18->field_4).stats)->similar = iVar47;
                      ((ppVar18->field_4).stats)->length = iVar46;
                      parasail_free(ptr_03);
                      parasail_free(b_01);
                      parasail_free(b_00);
                      parasail_free(b);
                      parasail_free(ptr_02);
                      parasail_free(ptr_01);
                      parasail_free(ptr_06);
                      parasail_free(ptr_00);
                      parasail_free(ptr_05);
                      parasail_free(ptr);
                      parasail_free(palVar21);
                      parasail_free(ptr_04);
                      parasail_free(local_320);
                      return ppVar18;
                    }
                    ppVar1 = (parasail_result_t *)(local_320 + uVar30);
                    lVar45 = palVar21[uVar30][0];
                    lVar48 = ptr_05[uVar30][0];
                    lVar42 = ptr_06[uVar30][0];
                    alVar109[0] = local_320 + uVar30;
                    auVar65._8_4_ = (int)(*alVar109[0])[0];
                    auVar65._0_8_ = (*alVar109[0])[0];
                    auVar65._12_4_ = *(undefined4 *)((long)*alVar109[0] + 4);
                    lVar39 = 0;
                    lVar38 = 0;
                    iVar62 = ptr_03[uVar40];
                    lVar35 = auVar65._8_8_;
                    lVar36 = 0;
                    lVar24 = (long)(int)(ppVar6->mapper[(byte)s2[uVar40]] * uVar11) * 0x10;
                    ppVar25 = (parasail_result_t *)(lVar24 + (long)pvVar8);
                    auVar95 = ZEXT816(0);
                    auVar96 = ZEXT816(0);
                    ppVar26 = ppVar25;
                    alVar109[0] = ptr_05;
                    palVar19 = ptr_06;
                    lVar37 = uVar30 * 0x10;
                    lVar41 = local_230;
                    auVar98 = _DAT_008a1f70;
                    auVar66 = auVar51;
                    for (lVar32 = 0; uStack_150 = (ulong)(uint)gap, size << 4 != lVar32;
                        lVar32 = lVar32 + 0x10) {
                      auVar65 = *(undefined1 (*) [16])((long)*ptr_02 + lVar32);
                      auVar75 = *(undefined1 (*) [16])((long)*b + lVar32);
                      auVar82 = *(undefined1 (*) [16])((long)*b_00 + lVar32);
                      plVar2 = (long *)((long)pvVar5 + lVar32 + lVar24);
                      auVar89._0_8_ = iVar62 + *plVar2;
                      auVar89._8_8_ = lVar35 + plVar2[1];
                      auVar92._0_8_ = -(ulong)(auVar65._0_8_ < auVar89._0_8_);
                      auVar92._8_8_ = -(ulong)(auVar65._8_8_ < auVar89._8_8_);
                      auVar92 = blendvpd(auVar65,auVar89,auVar92);
                      auVar81._0_8_ = -(ulong)(auVar66._0_8_ < auVar92._0_8_);
                      auVar81._8_8_ = -(ulong)(auVar66._8_8_ < auVar92._8_8_);
                      auVar102 = blendvpd(auVar66,auVar92,auVar81);
                      auVar92 = *(undefined1 (*) [16])((long)*b_01 + lVar32);
                      *(undefined1 (*) [16])((long)*ptr_04 + lVar32) = auVar102;
                      auVar93 = blendvpd(auVar95,auVar75,auVar81);
                      plVar2 = (long *)((long)pvVar7 + lVar32 + lVar24);
                      auVar94._0_8_ = lVar39 + *plVar2;
                      auVar94._8_8_ = lVar45 + plVar2[1];
                      lVar39 = auVar102._0_8_;
                      auVar74._0_8_ = -(ulong)(auVar89._0_8_ == lVar39);
                      lVar104 = auVar102._8_8_;
                      auVar74._8_8_ = -(ulong)(auVar89._8_8_ == lVar104);
                      auVar94 = blendvpd(auVar93,auVar94,auVar74);
                      *(undefined1 (*) [16])((long)*ptr + lVar32) = auVar94;
                      auVar93 = blendvpd(auVar96,auVar82,auVar81);
                      plVar2 = (long *)((long)&ppVar25->score + lVar32);
                      auVar91._0_8_ = lVar38 + *plVar2;
                      auVar91._8_8_ = lVar48 + plVar2[1];
                      auVar91 = blendvpd(auVar93,auVar91,auVar74);
                      auVar88 = blendvpd(auVar98,auVar92,auVar81);
                      *(undefined1 (*) [16])((long)*ptr_00 + lVar32) = auVar91;
                      auVar93._8_4_ = 0xffffffff;
                      auVar93._0_8_ = 0xffffffffffffffff;
                      auVar93._12_4_ = 0xffffffff;
                      auVar86._0_8_ = lVar36 + 1;
                      auVar86._8_8_ = lVar42 - auVar93._8_8_;
                      auVar89 = blendvpd(auVar88,auVar86,auVar74);
                      *(undefined1 (*) [16])((long)*ptr_01 + lVar32) = auVar89;
                      lVar35 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 8);
                      *(int *)(lVar35 + lVar41) = auVar94._0_4_;
                      uVar9 = extractps(auVar94,2);
                      *(undefined8 *)((long)&ppVar43->score + lVar35 + lVar41) = uVar9;
                      lVar35 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x10);
                      *(int *)(lVar35 + lVar41) = auVar91._0_4_;
                      uVar9 = extractps(auVar91,2);
                      *(undefined8 *)((long)&ppVar43->score + lVar35 + lVar41) = uVar9;
                      lVar35 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x18);
                      *(int *)(lVar35 + lVar41) = auVar89._0_4_;
                      uVar9 = extractps(auVar89,2);
                      *(undefined8 *)((long)&ppVar43->score + lVar35 + lVar41) = uVar9;
                      lVar35 = *((ppVar18->field_4).trace)->trace_del_table;
                      *(int *)(lVar35 + lVar41) = auVar102._0_4_;
                      *(int *)((long)&ppVar43->score + lVar35 + lVar41) = auVar102._8_4_;
                      auVar88._0_8_ = -(ulong)(local_2f8._0_8_ < lVar39);
                      auVar88._8_8_ = -(ulong)(local_2f8._8_8_ < lVar104);
                      local_2f8 = blendvpd(auVar102,local_2f8,auVar88);
                      auVar52._0_8_ = -(ulong)(lVar39 < local_248._0_8_);
                      auVar52._8_8_ = -(ulong)(lVar104 < local_248._8_8_);
                      auVar93 = blendvpd(auVar102,local_248,auVar52);
                      auVar102._0_8_ = -(ulong)(auVar94._0_8_ < auVar93._0_8_);
                      auVar102._8_8_ = -(ulong)(auVar94._8_8_ < auVar93._8_8_);
                      auVar93 = blendvpd(auVar94,auVar93,auVar102);
                      auVar53._0_8_ = -(ulong)(auVar91._0_8_ < auVar93._0_8_);
                      auVar53._8_8_ = -(ulong)(auVar91._8_8_ < auVar93._8_8_);
                      auVar93 = blendvpd(auVar91,auVar93,auVar53);
                      auVar54._0_8_ = -(ulong)(auVar89._0_8_ < auVar93._0_8_);
                      auVar54._8_8_ = -(ulong)(auVar89._8_8_ < auVar93._8_8_);
                      local_248 = blendvpd(auVar89,auVar93,auVar54);
                      auVar103._0_8_ = lVar39 - (ulong)(uint)open;
                      auVar103._8_8_ = lVar104 - (ulong)(uint)open;
                      auVar64._0_8_ = auVar65._0_8_ - uVar49;
                      auVar64._8_8_ = auVar65._8_8_ - uStack_150;
                      auVar55._0_8_ = -(ulong)(auVar64._0_8_ < auVar103._0_8_);
                      auVar55._8_8_ = -(ulong)(auVar64._8_8_ < auVar103._8_8_);
                      auVar93 = blendvpd(auVar64,auVar103,auVar55);
                      b_02[1] = (longlong)ppVar18;
                      b_02[0] = (longlong)ppVar43;
                      a[1] = (longlong)palVar19;
                      a[0] = lVar37;
                      ppVar26 = ppVar18;
                      alVar109 = _mm_cmpgt_epi64_rpl(a,b_02);
                      b_03[0] = alVar109[1];
                      auVar65 = pblendvb(auVar75,auVar94,extraout_XMM0);
                      auVar75 = pblendvb(auVar82,auVar91,extraout_XMM0);
                      local_68 = auVar92._0_8_;
                      lStack_60 = auVar92._8_8_;
                      auVar87._8_4_ = 0xffffffff;
                      auVar87._0_8_ = 0xffffffffffffffff;
                      auVar87._12_4_ = 0xffffffff;
                      auVar82._0_8_ = local_68 + 1;
                      auVar82._8_8_ = lStack_60 - auVar87._8_8_;
                      auVar90._0_8_ = auVar89._0_8_ + 1;
                      auVar90._8_8_ = auVar89._8_8_ - auVar87._8_8_;
                      auVar82 = pblendvb(auVar82,auVar90,extraout_XMM0);
                      local_98 = auVar93._0_8_;
                      uStack_90 = auVar93._8_8_;
                      puVar3 = (undefined8 *)((long)*ptr_02 + lVar32);
                      *puVar3 = local_98;
                      puVar3[1] = uStack_90;
                      *(undefined1 (*) [16])((long)*b + lVar32) = auVar65;
                      *(undefined1 (*) [16])((long)*b_00 + lVar32) = auVar75;
                      *(undefined1 (*) [16])((long)*b_01 + lVar32) = auVar82;
                      auVar83._0_8_ = auVar66._0_8_ - uVar49;
                      auVar83._8_8_ = auVar66._8_8_ - uStack_150;
                      auVar75._0_8_ = -(ulong)(auVar83._0_8_ < auVar103._0_8_);
                      auVar75._8_8_ = -(ulong)(auVar83._8_8_ < auVar103._8_8_);
                      auVar66 = blendvpd(auVar83,auVar103,auVar75);
                      b_03[1] = (longlong)ppVar26;
                      a_00[1] = (longlong)palVar19;
                      a_00[0] = lVar37;
                      alVar109 = _mm_cmpgt_epi64_rpl(a_00,b_03);
                      alVar109[0] = alVar109[1];
                      local_278 = auVar98._0_8_;
                      lStack_270 = auVar98._8_8_;
                      auVar95 = pblendvb(auVar95,auVar94,extraout_XMM0_00);
                      auVar96 = pblendvb(auVar96,auVar91,extraout_XMM0_00);
                      auVar97._0_8_ = local_278 + 1;
                      auVar97._8_8_ = lStack_270 + 1;
                      auVar98 = pblendvb(auVar97,auVar90,extraout_XMM0_00);
                      plVar2 = (long *)((long)*local_320 + lVar32);
                      iVar62 = *plVar2;
                      lVar35 = plVar2[1];
                      plVar2 = (long *)((long)*palVar21 + lVar32);
                      lVar39 = *plVar2;
                      lVar45 = plVar2[1];
                      plVar2 = (long *)((long)*ptr_05 + lVar32);
                      lVar38 = *plVar2;
                      lVar48 = plVar2[1];
                      plVar2 = (long *)((long)*ptr_06 + lVar32);
                      lVar36 = *plVar2;
                      lVar42 = plVar2[1];
                      lVar41 = lVar41 + uVar33 * 4;
                    }
                    auVar65 = local_2f8;
                    local_2f8 = auVar66;
                    for (iVar46 = 0; iVar46 != 2; iVar46 = iVar46 + 1) {
                      lVar35 = lVar34;
                      if (s2_beg == 0) {
                        lVar35 = ptr_03[uVar40 + 1] - uVar29;
                      }
                      auVar67._8_4_ = ppVar1->score;
                      auVar67._0_4_ = ppVar1->score;
                      auVar67._4_4_ = ppVar1->end_query;
                      auVar67._12_4_ = ppVar1->end_query;
                      auVar101._0_8_ = local_2f8._0_8_;
                      auVar101._8_4_ = local_2f8._0_4_;
                      auVar101._12_4_ = local_2f8._4_4_;
                      auVar16._8_8_ = 0;
                      auVar16._0_8_ = auVar95._0_8_;
                      auVar95 = auVar16 << 0x40;
                      auVar12._8_8_ = 0;
                      auVar12._0_8_ = auVar96._0_8_;
                      auVar96 = auVar12 << 0x40;
                      auVar99._0_8_ = auVar98._0_8_;
                      auVar99._8_4_ = auVar98._0_4_;
                      auVar99._12_4_ = auVar98._4_4_;
                      iVar62 = ptr_03[uVar40];
                      lVar36 = auVar67._8_8_;
                      local_2f8._8_8_ = auVar101._8_8_;
                      local_2f8._0_8_ = lVar35;
                      auVar98._8_8_ = auVar99._8_8_;
                      auVar98._0_8_ = 1;
                      ppVar26 = ppVar1;
                      lVar35 = local_230;
                      for (lVar38 = 0; size << 4 != lVar38; lVar38 = lVar38 + 0x10) {
                        plVar2 = (long *)((long)pvVar5 + lVar38 + lVar24);
                        lVar39 = *plVar2;
                        lVar41 = plVar2[1];
                        auVar66 = *(undefined1 (*) [16])((long)*ptr_04 + lVar38);
                        auVar56._0_8_ = -(ulong)(local_2f8._0_8_ < auVar66._0_8_);
                        auVar56._8_8_ = -(ulong)(local_2f8._8_8_ < auVar66._8_8_);
                        auVar82 = blendvpd(local_2f8,auVar66,auVar56);
                        *(undefined1 (*) [16])((long)*ptr_04 + lVar38) = auVar82;
                        lVar32 = auVar82._0_8_;
                        auVar68._0_8_ = -(ulong)(iVar62 + lVar39 == lVar32);
                        lVar39 = auVar82._8_8_;
                        auVar68._8_8_ = -(ulong)(lVar36 + lVar41 == lVar39);
                        auVar68 = auVar68 | auVar56;
                        auVar75 = blendvpd(auVar95,*(undefined1 (*) [16])((long)*ptr + lVar38),
                                           auVar68);
                        *(undefined1 (*) [16])((long)*ptr + lVar38) = auVar75;
                        auVar93 = blendvpd(auVar96,*(undefined1 (*) [16])((long)*ptr_00 + lVar38),
                                           auVar68);
                        *(undefined1 (*) [16])((long)*ptr_00 + lVar38) = auVar93;
                        auVar92 = blendvpd(auVar98,*(undefined1 (*) [16])((long)*ptr_01 + lVar38),
                                           auVar68);
                        *(undefined1 (*) [16])((long)*ptr_01 + lVar38) = auVar92;
                        auVar57._0_8_ = -(ulong)(auVar65._0_8_ < lVar32);
                        auVar57._8_8_ = -(ulong)(auVar65._8_8_ < lVar39);
                        auVar65 = blendvpd(auVar82,auVar65,auVar57);
                        auVar58._0_8_ = -(ulong)(lVar32 < local_248._0_8_);
                        auVar58._8_8_ = -(ulong)(lVar39 < local_248._8_8_);
                        auVar66 = blendvpd(auVar82,local_248,auVar58);
                        auVar59._0_8_ = -(ulong)(auVar75._0_8_ < auVar66._0_8_);
                        auVar59._8_8_ = -(ulong)(auVar75._8_8_ < auVar66._8_8_);
                        lVar36 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 8);
                        *(int *)(lVar36 + lVar35) = auVar75._0_4_;
                        *(int *)((long)&ppVar43->score + lVar36 + lVar35) = auVar75._8_4_;
                        auVar66 = blendvpd(auVar75,auVar66,auVar59);
                        lVar36 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x10)
                        ;
                        *(int *)(lVar36 + lVar35) = auVar93._0_4_;
                        uVar9 = extractps(auVar93,2);
                        *(undefined8 *)((long)&ppVar43->score + lVar36 + lVar35) = uVar9;
                        auVar60._0_8_ = -(ulong)(auVar93._0_8_ < auVar66._0_8_);
                        auVar60._8_8_ = -(ulong)(auVar93._8_8_ < auVar66._8_8_);
                        lVar36 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x18)
                        ;
                        *(int *)(lVar36 + lVar35) = auVar92._0_4_;
                        uVar9 = extractps(auVar92,2);
                        *(undefined8 *)((long)&ppVar43->score + lVar36 + lVar35) = uVar9;
                        auVar66 = blendvpd(auVar93,auVar66,auVar60);
                        lVar36 = *((ppVar18->field_4).trace)->trace_del_table;
                        *(int *)(lVar36 + lVar35) = auVar82._0_4_;
                        *(int *)((long)&ppVar43->score + lVar36 + lVar35) = auVar82._8_4_;
                        auVar61._0_8_ = -(ulong)(auVar92._0_8_ < auVar66._0_8_);
                        auVar61._8_8_ = -(ulong)(auVar92._8_8_ < auVar66._8_8_);
                        local_248 = blendvpd(auVar92,auVar66,auVar61);
                        lVar36 = local_2f8._0_8_ - uVar49;
                        local_2f8._8_8_ = local_2f8._8_8_ - uStack_150;
                        local_2f8._0_8_ = lVar36;
                        b_04[1] = (longlong)ppVar43;
                        b_04[0] = (longlong)alVar109[0];
                        a_01[1] = (longlong)palVar19;
                        a_01[0] = lVar37;
                        ppVar26 = ppVar43;
                        alVar109 = _mm_cmpgt_epi64_rpl(a_01,b_04);
                        alVar109[0] = alVar109[1];
                        auVar76._0_8_ = -(ulong)(lVar36 == lVar32 - (ulong)(uint)open);
                        auVar76._8_8_ = -(ulong)(local_2f8._8_8_ == lVar39 - (ulong)(uint)open);
                        auVar76 = auVar76 | extraout_XMM0_01;
                        if ((((((((((((((((auVar76 >> 7 & (undefined1  [16])0x1) ==
                                          (undefined1  [16])0x0 &&
                                         (auVar76 >> 0xf & (undefined1  [16])0x1) ==
                                         (undefined1  [16])0x0) &&
                                        (auVar76 >> 0x17 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0) &&
                                       (auVar76 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar76 >> 0x27 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar76 >> 0x2f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar76 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar76 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar76 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar76 >> 0x4f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar76 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar76 >> 0x67 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar76 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar76 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar76[0xf]) goto LAB_00691b29;
                        alVar109[1] = (longlong)ppVar26;
                        a_02[1] = (longlong)palVar19;
                        a_02[0] = lVar37;
                        alVar109 = _mm_cmpgt_epi64_rpl(a_02,alVar109);
                        alVar109[0] = alVar109[1];
                        auVar95 = pblendvb(auVar95,auVar75,extraout_XMM0_02);
                        auVar96 = pblendvb(auVar96,auVar93,extraout_XMM0_02);
                        auVar69._8_4_ = 0xffffffff;
                        auVar69._0_8_ = 0xffffffffffffffff;
                        auVar69._12_4_ = 0xffffffff;
                        local_278 = auVar98._0_8_;
                        auVar100._0_8_ = local_278 + 1;
                        auVar100._8_8_ = auVar98._8_8_ - auVar69._8_8_;
                        auVar77._0_8_ = auVar92._0_8_ + 1;
                        auVar77._8_8_ = auVar92._8_8_ - auVar69._8_8_;
                        auVar98 = pblendvb(auVar100,auVar77,extraout_XMM0_02);
                        plVar2 = (long *)((long)*local_320 + lVar38);
                        iVar62 = *plVar2;
                        lVar36 = plVar2[1];
                        lVar35 = lVar35 + uVar33 * 4;
                      }
                    }
LAB_00691b29:
                    local_2f8 = auVar65;
                    alVar105 = ptr_04[uVar10];
                    alVar106 = ptr[uVar10];
                    alVar107 = ptr_00[uVar10];
                    alVar108 = ptr_01[uVar10];
                    b_05[1] = (longlong)ppVar26;
                    b_05[0] = (longlong)alVar109[0];
                    a_03[1] = (longlong)palVar19;
                    a_03[0] = lVar37;
                    _mm_cmpgt_epi64_rpl(a_03,b_05);
                    local_188 = pblendvb(local_188,(undefined1  [16])alVar105,extraout_XMM0_03);
                    auVar50 = pblendvb(auVar50,(undefined1  [16])alVar106,extraout_XMM0_03);
                    auVar73 = pblendvb(auVar73,(undefined1  [16])alVar107,extraout_XMM0_03);
                    auVar84 = pblendvb(auVar84,(undefined1  [16])alVar108,extraout_XMM0_03);
                    auVar66 = extraout_XMM0_03 & local_178;
                    if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar66 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar66 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar66 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar66 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar66 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar66 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar66 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar66 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar66 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar66 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar66 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar66 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar66[0xf] < '\0') {
                      iVar23 = (int)uVar40;
                    }
                    uVar40 = uVar40 + 1;
                    local_230 = local_230 + 4;
                    alVar109[0] = local_320;
                    palVar19 = ptr;
                    palVar20 = ptr_00;
                    ptr = palVar21;
                    palVar21 = ptr_01;
                    ptr_01 = ptr_06;
                    ptr_00 = ptr_05;
                    lStack_f0 = local_2f8._8_8_;
                    local_320 = ptr_04;
                  } while( true );
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar27 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_table_striped_profile_sse41_128_64",pcVar27);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
            vMaxHM = _mm_slli_si128(vMaxHM, 8);
            vMaxHS = _mm_slli_si128(vMaxHS, 8);
            vMaxHL = _mm_slli_si128(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl(vMaxHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl(vMaxHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl(vMaxHL, 1);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}